

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

UVec2 __thiscall
vkt::texture::util::calcLevelBounds
          (util *this,Vec2 *lodBounds,int levelCount,VkSamplerMipmapMode mipmapFilter)

{
  deInt32 dVar1;
  uint uVar2;
  float *pfVar3;
  uint *puVar4;
  float x;
  undefined4 local_50;
  undefined4 local_28;
  int ndx;
  float q;
  VkSamplerMipmapMode mipmapFilter_local;
  int levelCount_local;
  Vec2 *lodBounds_local;
  UVec2 *levelBounds;
  
  x = (float)(levelCount + -1);
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)this);
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
    pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,0);
    if (0.5 < *pfVar3) {
      pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,0);
      if (x + 0.5 <= *pfVar3) {
        uVar2 = deRoundFloatToInt32(x);
        puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,0);
        *puVar4 = uVar2;
      }
      else {
        pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,0);
        dVar1 = deCeilFloatToInt32(*pfVar3 + 0.5);
        puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,0);
        *puVar4 = dVar1 - 1;
      }
    }
    else {
      puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,0);
      *puVar4 = 0;
    }
    pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,1);
    if (0.5 < *pfVar3 || *pfVar3 == 0.5) {
      pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,1);
      if (x + 0.5 <= *pfVar3) {
        uVar2 = deRoundFloatToInt32(x);
        puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,1);
        *puVar4 = uVar2;
      }
      else {
        pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,1);
        uVar2 = deFloorFloatToInt32(*pfVar3 + 0.5);
        puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,1);
        *puVar4 = uVar2;
      }
    }
    else {
      puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,1);
      *puVar4 = 0;
    }
  }
  else {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,local_28);
      if (*pfVar3 < x) {
        pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,local_28);
        if (0.0 < *pfVar3 || *pfVar3 == 0.0) {
          pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,local_28);
          local_50 = deFloorFloatToInt32(*pfVar3);
        }
        else {
          local_50 = 0;
        }
        puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,local_28);
        *puVar4 = local_50;
      }
      else {
        uVar2 = deRoundFloatToInt32(x);
        puVar4 = tcu::Vector<unsigned_int,_2>::operator[]((Vector<unsigned_int,_2> *)this,local_28);
        *puVar4 = uVar2;
      }
    }
  }
  return (UVec2)(uint  [2])this;
}

Assistant:

UVec2 calcLevelBounds (const Vec2&			lodBounds,
					   const int			levelCount,
					   VkSamplerMipmapMode	mipmapFilter)
{
	DE_ASSERT(lodBounds[0] <= lodBounds[1]);
	DE_ASSERT(levelCount > 0);

	const float q = (float) (levelCount - 1);

	UVec2 levelBounds;

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST)
	{
		if (lodBounds[0] <= 0.5f)
		{
			levelBounds[0] = 0;
		}
		else if (lodBounds[0] < q + 0.5f)
		{
			levelBounds[0] = deCeilFloatToInt32(lodBounds[0] + 0.5f) - 1;
		}
		else
		{
			levelBounds[0] = deRoundFloatToInt32(q);
		}

		if (lodBounds[1] < 0.5f)
		{
			levelBounds[1] = 0;
		}
		else if (lodBounds[1] < q + 0.5f)
		{
			levelBounds[1] = deFloorFloatToInt32(lodBounds[1] + 0.5f);
		}
		else
		{
			levelBounds[1] = deRoundFloatToInt32(q);
		}
	}
	else
	{
		for (int ndx = 0; ndx < 2; ++ndx)
		{
			if (lodBounds[ndx] >= q)
			{
				levelBounds[ndx] = deRoundFloatToInt32(q);
			}
			else
			{
				levelBounds[ndx] = lodBounds[ndx] < 0.0f ? 0 : deFloorFloatToInt32(lodBounds[ndx]);
			}
		}
	}

	return levelBounds;
}